

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void cfd::core::AnalyzeBip32KeyData
               (void *extkey,string *base58,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data,
               uint32_t *version,uint8_t *depth,uint32_t *child,ByteData256 *chaincode,
               Privkey *privkey,Pubkey *pubkey,uint32_t *fingerprint)

{
  uchar *bytes;
  char *pcVar1;
  CfdException *pCVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar3;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *this;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  string clsname;
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> chaincode_bytes;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_120;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  ext_key output;
  
  memset(&output,0,0xc0);
  pcVar1 = "Constructor_ExtPrivkey";
  if (privkey == (Privkey *)0x0) {
    pcVar1 = "Constructor_ExtPubkey";
  }
  ::std::__cxx11::string::string((string *)&clsname,pcVar1 + 0xc,(allocator *)&pubkey_bytes);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&data,0x52,(allocator_type *)&pubkey_bytes);
  if (extkey == (void *)0x0) {
    if (base58 == (string *)0x0) {
      pvVar3 = serialize_data;
      if (serialize_data == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0)
      goto LAB_00375540;
    }
    else {
      chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ret = wally_base58_to_bytes
                      ((base58->_M_dataplus)._M_p,1,
                       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,(size_t *)&chaincode_bytes);
      if (ret != 0) {
        pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
        pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0x45;
        pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = "AnalyzeBip32KeyData";
        logger::warn<std::__cxx11::string&,int&>
                  ((CfdSourceLocation *)&pubkey_bytes,"{} wally_base58_to_bytes error. ret={}",
                   &clsname,&ret);
        pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pubkey_bytes,&clsname," base58 decode error.");
        CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pubkey_bytes);
        __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&data,(size_type)
                       chaincode_bytes.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
      pvVar3 = &data;
      if (serialize_data != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (serialize_data,&data);
      }
    }
    bytes = (pvVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
    ret = bip32_key_unserialize
                    (bytes,(long)(pvVar3->
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)bytes,&output);
    if (ret != 0) {
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x5a;
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "AnalyzeBip32KeyData";
      logger::warn<std::__cxx11::string&,int&>
                ((CfdSourceLocation *)&pubkey_bytes,"{} bip32_key_unserialize error. ret={}",
                 &clsname,&ret);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pubkey_bytes,&clsname," unserialize error.");
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&pubkey_bytes);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  else {
    memcpy(&output,extkey,0xc0);
  }
LAB_00375540:
  *version = output.version;
  *depth = output.depth;
  *child = output.child_num;
  if (fingerprint != (uint32_t *)0x0) {
    *fingerprint = output.parent160._0_4_;
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&chaincode_bytes,0x20,(allocator_type *)&pubkey_bytes);
  memcpy(chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start,&output,
         (long)chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start);
  ByteData256::ByteData256((ByteData256 *)&pubkey_bytes,&chaincode_bytes);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&chaincode->data_,
             &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  if (privkey == (Privkey *)0x0) {
    if (pubkey == (Pubkey *)0x0) goto LAB_00375714;
    if (output.priv_key[0] == '\0') {
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x76;
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "AnalyzeBip32KeyData";
      logger::warn<std::__cxx11::string&>
                ((CfdSourceLocation *)&pubkey_bytes,"{} privkey enabled.",&clsname);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pubkey_bytes,&clsname," keytype error.");
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&pubkey_bytes);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&pubkey_bytes,0x21,(allocator_type *)&privkey_bytes);
    memcpy(pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,output.pub_key,
           CONCAT44(pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish._4_4_,
                    pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish._0_4_) -
           (long)pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    ByteData::ByteData((ByteData *)&local_120,&pubkey_bytes);
    Pubkey::Pubkey((Pubkey *)&privkey_bytes,(ByteData *)&local_120);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey,
               &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_120);
    this = &pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  }
  else {
    if (output.priv_key[0] != '\0') {
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "cfdcore_hdwallet.cpp";
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0x6c;
      pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = "AnalyzeBip32KeyData";
      logger::warn<std::__cxx11::string&>
                ((CfdSourceLocation *)&pubkey_bytes,"{} privkey disabled.",&clsname);
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &pubkey_bytes,&clsname," keytype error.");
      CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&pubkey_bytes);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&privkey_bytes,0x20,(allocator_type *)&pubkey_bytes);
    memcpy(privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start,output.priv_key + 1,
           (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start);
    ByteData256::ByteData256((ByteData256 *)&local_108,&privkey_bytes);
    Privkey::Privkey((Privkey *)&pubkey_bytes,(ByteData256 *)&local_108,kMainnet,true);
    Privkey::operator=(privkey,(Privkey *)&pubkey_bytes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_bytes);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
    this = &privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(this);
LAB_00375714:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::__cxx11::string::~string((string *)&clsname);
  return;
}

Assistant:

static void AnalyzeBip32KeyData(
    const void* extkey, const std::string* base58,
    std::vector<uint8_t>* serialize_data, uint32_t* version, uint8_t* depth,
    uint32_t* child, ByteData256* chaincode, Privkey* privkey, Pubkey* pubkey,
    uint32_t* fingerprint) {
  struct ext_key output = {};
  std::string clsname = (privkey != nullptr) ? "ExtPrivkey" : "ExtPubkey";
  const std::vector<uint8_t>* serialize_bytes = nullptr;
  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN);
  int ret;

  if (extkey != nullptr) {
    memcpy(&output, extkey, sizeof(output));
  } else if (base58 != nullptr) {
    size_t written = 0;
    ret = wally_base58_to_bytes(
        base58->c_str(), BASE58_FLAG_CHECKSUM, data.data(), data.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "{} wally_base58_to_bytes error. ret={}", clsname,
          ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          clsname + " base58 decode error.");
    }
    data.resize(written);
    serialize_bytes = &data;
    if (serialize_data != nullptr) {
      *serialize_data = data;
    }
  } else {
    serialize_bytes = serialize_data;
  }

  if (serialize_bytes != nullptr) {
    // unserialize
    ret = bip32_key_unserialize(
        serialize_bytes->data(), serialize_bytes->size(), &output);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "{} bip32_key_unserialize error. ret={}", clsname,
          ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, clsname + " unserialize error.");
    }
  }

  *version = output.version;
  *depth = output.depth;
  *child = output.child_num;
  if (fingerprint) {
    memcpy(fingerprint, output.parent160, sizeof(*fingerprint));
  }
  std::vector<uint8_t> chaincode_bytes(kByteData256Length);
  memcpy(chaincode_bytes.data(), output.chain_code, chaincode_bytes.size());
  *chaincode = ByteData256(chaincode_bytes);
  if (privkey != nullptr) {
    if (output.priv_key[0] != BIP32_FLAG_KEY_PRIVATE) {
      warn(CFD_LOG_SOURCE, "{} privkey disabled.", clsname);
      throw CfdException(
          CfdError::kCfdIllegalStateError, clsname + " keytype error.");
    }
    // privkey
    std::vector<uint8_t> privkey_bytes(kByteData256Length);
    memcpy(privkey_bytes.data(), &output.priv_key[1], privkey_bytes.size());
    *privkey = Privkey(ByteData256(privkey_bytes));
  } else if (pubkey != nullptr) {
    if (output.priv_key[0] == BIP32_FLAG_KEY_PRIVATE) {
      warn(CFD_LOG_SOURCE, "{} privkey enabled.", clsname);
      throw CfdException(
          CfdError::kCfdIllegalStateError, clsname + " keytype error.");
    }
    std::vector<uint8_t> pubkey_bytes(Pubkey::kCompressedPubkeySize);
    memcpy(pubkey_bytes.data(), output.pub_key, pubkey_bytes.size());
    *pubkey = Pubkey(pubkey_bytes);
  }
}